

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O0

void __thiscall QTreeWidgetItem::~QTreeWidgetItem(QTreeWidgetItem *this)

{
  QTreeWidgetItem *pQVar1;
  bool bVar2;
  QTreeModel *m;
  qsizetype qVar3;
  const_reference ppQVar4;
  long lVar5;
  QTreeWidgetItem *in_RDI;
  long in_FS_OFFSET;
  QTreeWidgetItem *child;
  int i_2;
  int i_1;
  int i;
  QTreeModel *model;
  SkipSorting skipSorting;
  QTreeWidgetItem **in_stack_ffffffffffffff88;
  QListSpecialMethodsBase<QTreeWidgetItem_*> *in_stack_ffffffffffffff90;
  QTreeWidgetItemPrivate *pQVar6;
  QTreeWidget *in_stack_ffffffffffffff98;
  QTreeWidgetItem *in_stack_ffffffffffffffa0;
  QTreeModel *in_stack_ffffffffffffffb0;
  int local_44;
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  in_RDI->_vptr_QTreeWidgetItem = (_func_int **)&PTR__QTreeWidgetItem_00d31678;
  m = treeModel(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  local_18._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_18._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QTreeModel::SkipSorting::SkipSorting((SkipSorting *)local_18,m);
  if (in_RDI->par == (QTreeWidgetItem *)0x0) {
    if (m != (QTreeModel *)0x0) {
      if (in_RDI == m->headerItem) {
        m->headerItem = (QTreeWidgetItem *)0x0;
      }
      else {
        qVar3 = QListSpecialMethodsBase<QTreeWidgetItem*>::indexOf<QTreeWidgetItem*>
                          (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,0x913bb5);
        if (-1 < (int)qVar3) {
          QTreeModel::beginRemoveItems
                    (in_stack_ffffffffffffffb0,in_RDI,
                     (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20),(int)in_stack_ffffffffffffffa0)
          ;
          bVar2 = QList<QTreeWidgetItem_*>::isEmpty((QList<QTreeWidgetItem_*> *)0x913be9);
          if ((!bVar2) &&
             (ppQVar4 = QList<QTreeWidgetItem_*>::at
                                  ((QList<QTreeWidgetItem_*> *)in_stack_ffffffffffffff90,
                                   (qsizetype)in_stack_ffffffffffffff88), *ppQVar4 == in_RDI)) {
            QList<QTreeWidgetItem_*>::takeAt
                      ((QList<QTreeWidgetItem_*> *)in_stack_ffffffffffffffa0,
                       (qsizetype)in_stack_ffffffffffffff98);
          }
          QTreeModel::endRemoveItems((QTreeModel *)0x913c2f);
        }
      }
    }
  }
  else {
    qVar3 = QListSpecialMethodsBase<QTreeWidgetItem*>::indexOf<QTreeWidgetItem*>
                      (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,0x913ac8);
    if (-1 < (int)qVar3) {
      if (m != (QTreeModel *)0x0) {
        QTreeModel::beginRemoveItems
                  (in_stack_ffffffffffffffb0,in_RDI,(int)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                   (int)in_stack_ffffffffffffffa0);
      }
      bVar2 = QList<QTreeWidgetItem_*>::isEmpty((QList<QTreeWidgetItem_*> *)0x913b0d);
      if ((!bVar2) &&
         (ppQVar4 = QList<QTreeWidgetItem_*>::at
                              ((QList<QTreeWidgetItem_*> *)in_stack_ffffffffffffff90,
                               (qsizetype)in_stack_ffffffffffffff88), *ppQVar4 == in_RDI)) {
        QList<QTreeWidgetItem_*>::takeAt
                  ((QList<QTreeWidgetItem_*> *)in_stack_ffffffffffffffa0,
                   (qsizetype)in_stack_ffffffffffffff98);
      }
      if (m != (QTreeModel *)0x0) {
        QTreeModel::endRemoveItems((QTreeModel *)0x913b5b);
      }
    }
  }
  local_44 = 0;
  while( true ) {
    lVar5 = (long)local_44;
    qVar3 = QList<QTreeWidgetItem_*>::size(&in_RDI->children);
    if (qVar3 <= lVar5) break;
    ppQVar4 = QList<QTreeWidgetItem_*>::at
                        ((QList<QTreeWidgetItem_*> *)in_stack_ffffffffffffff90,
                         (qsizetype)in_stack_ffffffffffffff88);
    pQVar1 = *ppQVar4;
    pQVar1->par = (QTreeWidgetItem *)0x0;
    pQVar1->view = (QTreeWidget *)0x0;
    if (pQVar1 != (QTreeWidgetItem *)0x0) {
      (*pQVar1->_vptr_QTreeWidgetItem[1])();
    }
    local_44 = local_44 + 1;
  }
  QList<QTreeWidgetItem_*>::clear((QList<QTreeWidgetItem_*> *)in_stack_ffffffffffffff90);
  pQVar6 = in_RDI->d;
  if (pQVar6 != (QTreeWidgetItemPrivate *)0x0) {
    QTreeWidgetItemPrivate::~QTreeWidgetItemPrivate((QTreeWidgetItemPrivate *)0x913cf0);
    operator_delete(pQVar6,0x30);
  }
  QTreeModel::SkipSorting::~SkipSorting((SkipSorting *)local_18);
  QList<QTreeWidgetItem_*>::~QList((QList<QTreeWidgetItem_*> *)0x913d17);
  QList<QList<QWidgetItemData>_>::~QList((QList<QList<QWidgetItemData>_> *)0x913d25);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QTreeWidgetItem::~QTreeWidgetItem()
{
    QTreeModel *model = treeModel();
    QTreeModel::SkipSorting skipSorting(model);

    if (par) {
        int i = par->children.indexOf(this);
        if (i >= 0) {
            if (model) model->beginRemoveItems(par, i, 1);
            // users _could_ do changes when connected to rowsAboutToBeRemoved,
            // so we check again to make sure 'i' is valid
            if (!par->children.isEmpty() && par->children.at(i) == this)
                par->children.takeAt(i);
            if (model) model->endRemoveItems();
        }
    } else if (model) {
        if (this == model->headerItem) {
            model->headerItem = nullptr;
        } else {
            int i = model->rootItem->children.indexOf(this);
            if (i >= 0) {
                model->beginRemoveItems(nullptr, i, 1);
                // users _could_ do changes when connected to rowsAboutToBeRemoved,
                // so we check again to make sure 'i' is valid
                if (!model->rootItem->children.isEmpty() && model->rootItem->children.at(i) == this)
                    model->rootItem->children.takeAt(i);
                model->endRemoveItems();
            }
        }
    }
    // at this point the persistent indexes for the children should also be invalidated
    // since we invalidated the parent
    for (int i = 0; i < children.size(); ++i) {
        QTreeWidgetItem *child = children.at(i);
        // make sure the child does not try to remove itself from our children list
        child->par = nullptr;
        // make sure the child does not try to remove itself from the top level list
        child->view = nullptr;
        delete child;
    }

    children.clear();
    delete d;
}